

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O0

int __thiscall
cmCPackIFWPackage::ConfigureFromGroup(cmCPackIFWPackage *this,cmCPackComponentGroup *group)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  mapped_type *pmVar3;
  size_type sVar4;
  string *psVar5;
  ostream *poVar6;
  char *pcVar7;
  string *psVar8;
  string local_518 [32];
  undefined1 local_4f8 [8];
  ostringstream cmCPackLog_msg_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  cmValue local_360;
  cmValue option_3;
  undefined1 local_338 [8];
  ostringstream cmCPackLog_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  cmValue local_198;
  cmValue option_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  cmValue local_168;
  cmValue option_1;
  cmValue local_140;
  cmValue option;
  string local_130;
  cmValue local_110;
  cmValue optPACKAGE_VERSION;
  cmValue local_e8;
  cmValue optVERSION;
  key_type local_d8;
  allocator<char> local_b1;
  key_type local_b0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string prefix;
  cmCPackComponentGroup *group_local;
  cmCPackIFWPackage *this_local;
  
  if (group == (cmCPackComponentGroup *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    prefix.field_2._8_8_ = group;
    DefaultConfiguration(this);
    cmsys::SystemTools::UpperCase(&local_80,(string *)prefix.field_2._8_8_);
    std::operator+(&local_60,"CPACK_IFW_COMPONENT_GROUP_",&local_80);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_60,"_");
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    psVar8 = (string *)(prefix.field_2._8_8_ + 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"",&local_b1);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->DisplayName,&local_b0);
    std::__cxx11::string::operator=((string *)pmVar3,psVar8);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    psVar8 = (string *)(prefix.field_2._8_8_ + 0x40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"",(allocator<char> *)((long)&optVERSION.Value + 7));
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->Description,&local_d8);
    std::__cxx11::string::operator=((string *)pmVar3,psVar8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&optVERSION.Value + 7));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &optPACKAGE_VERSION,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "VERSION");
    local_e8 = cmCPackIFWCommon::GetOption
                         (&this->super_cmCPackIFWCommon,(string *)&optPACKAGE_VERSION);
    std::__cxx11::string::~string((string *)&optPACKAGE_VERSION);
    bVar2 = cmValue::operator_cast_to_bool(&local_e8);
    if (bVar2) {
      psVar5 = cmValue::operator*[abi_cxx11_(&local_e8);
      std::__cxx11::string::operator=((string *)&this->Version,(string *)psVar5);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"CPACK_PACKAGE_VERSION",
                 (allocator<char> *)((long)&option.Value + 7));
      local_110 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator((allocator<char> *)((long)&option.Value + 7));
      bVar2 = cmValue::operator_cast_to_bool(&local_110);
      if (bVar2) {
        psVar5 = cmValue::operator*[abi_cxx11_(&local_110);
        std::__cxx11::string::operator=((string *)&this->Version,(string *)psVar5);
      }
      else {
        std::__cxx11::string::operator=((string *)&this->Version,"1.0.0");
      }
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&option_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "SCRIPT");
    local_140 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&option_1);
    std::__cxx11::string::~string((string *)&option_1);
    bVar2 = cmValue::operator_cast_to_bool(&local_140);
    if (bVar2) {
      psVar5 = cmValue::operator*[abi_cxx11_(&local_140);
      std::__cxx11::string::operator=((string *)&this->Script,(string *)psVar5);
    }
    std::operator+(&local_188,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "USER_INTERFACES");
    local_168 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    bVar2 = cmValue::operator_cast_to_bool(&local_168);
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->UserInterfaces);
      option_2.Value = local_168.Value;
      cmExpandList(local_168,&this->UserInterfaces,false);
    }
    std::operator+(&local_1b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "LICENSES");
    local_198 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    bVar2 = cmValue::operator_cast_to_bool(&local_198);
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->Licenses);
      cmExpandList(local_198,&this->Licenses,false);
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->Licenses);
      if ((sVar4 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_338);
        poVar6 = std::operator<<((ostream *)local_338,(string *)local_40);
        poVar6 = std::operator<<(poVar6,"LICENSES");
        poVar6 = std::operator<<(poVar6," should contain pairs of <display_name> and <file_path>.");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        if ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0) {
          pcVar1 = (((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).Logger;
          std::__cxx11::ostringstream::str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                          ,0x141,pcVar7);
          std::__cxx11::string::~string((string *)&option_3);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_338);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&this->Licenses);
      }
    }
    std::operator+(&local_380,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "PRIORITY");
    local_360 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    bVar2 = cmValue::operator_cast_to_bool(&local_360);
    if (bVar2) {
      psVar5 = cmValue::operator*[abi_cxx11_(&local_360);
      std::__cxx11::string::operator=((string *)&this->SortingPriority,(string *)psVar5);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
      poVar6 = std::operator<<((ostream *)local_4f8,"The \"PRIORITY\" option is set ");
      poVar6 = std::operator<<(poVar6,"for component group \"");
      poVar6 = std::operator<<(poVar6,(string *)prefix.field_2._8_8_);
      poVar6 = std::operator<<(poVar6,"\", but there option is ");
      poVar6 = std::operator<<(poVar6,"deprecated. Please use \"SORTING_PRIORITY\" option instead.")
      ;
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      if ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0) {
        pcVar1 = (((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).Logger;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                        ,0x14f,pcVar7);
        std::__cxx11::string::~string(local_518);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f8);
    }
    this_local._4_4_ = ConfigureFromPrefix(this,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  return this_local._4_4_;
}

Assistant:

int cmCPackIFWPackage::ConfigureFromGroup(cmCPackComponentGroup* group)
{
  if (!group) {
    return 0;
  }

  // Restore default configuration
  this->DefaultConfiguration();

  std::string prefix = "CPACK_IFW_COMPONENT_GROUP_" +
    cmsys::SystemTools::UpperCase(group->Name) + "_";

  this->DisplayName[""] = group->DisplayName;
  this->Description[""] = group->Description;

  // Version
  if (cmValue optVERSION = this->GetOption(prefix + "VERSION")) {
    this->Version = *optVERSION;
  } else if (cmValue optPACKAGE_VERSION =
               this->GetOption("CPACK_PACKAGE_VERSION")) {
    this->Version = *optPACKAGE_VERSION;
  } else {
    this->Version = "1.0.0";
  }

  // Script
  if (cmValue option = this->GetOption(prefix + "SCRIPT")) {
    this->Script = *option;
  }

  // User interfaces
  if (cmValue option = this->GetOption(prefix + "USER_INTERFACES")) {
    this->UserInterfaces.clear();
    cmExpandList(option, this->UserInterfaces);
  }

  // Licenses
  if (cmValue option = this->GetOption(prefix + "LICENSES")) {
    this->Licenses.clear();
    cmExpandList(option, this->Licenses);
    if (this->Licenses.size() % 2 != 0) {
      cmCPackIFWLogger(
        WARNING,
        prefix << "LICENSES"
               << " should contain pairs of <display_name> and <file_path>."
               << std::endl);
      this->Licenses.clear();
    }
  }

  // Priority
  if (cmValue option = this->GetOption(prefix + "PRIORITY")) {
    this->SortingPriority = *option;
    cmCPackIFWLogger(
      WARNING,
      "The \"PRIORITY\" option is set "
        << "for component group \"" << group->Name
        << "\", but there option is "
        << "deprecated. Please use \"SORTING_PRIORITY\" option instead."
        << std::endl);
  }

  return this->ConfigureFromPrefix(prefix);
}